

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O3

void chrono::fea::ChMeshFileLoader::FromAbaqusFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChContinuumMaterial> *my_material,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>_>
               *node_sets,ChVector<double> *pos_transform,ChMatrix33<double> *rot_transform,
               bool discard_unused_nodes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ChMesh *pCVar11;
  _Base_ptr p_Var12;
  undefined1 auVar13 [16];
  _Alloc_hider _Var14;
  size_type sVar15;
  shared_ptr<chrono::fea::ChMesh> *psVar16;
  char cVar17;
  int iVar18;
  ChLog *pCVar19;
  ChStreamOutAscii *pCVar20;
  istream *piVar21;
  mapped_type *pmVar22;
  ChElementTetraCorot_4 *pCVar23;
  _Base_ptr p_Var24;
  ChException *pCVar25;
  long *plVar26;
  long lVar27;
  ulong uVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  size_type *psVar30;
  pointer_____offset_0x10___ *ppuVar31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var32;
  ulong uVar33;
  _Alloc_hider _Var34;
  uint uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>,_bool>
  pVar40;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode_1;
  string token;
  string line;
  shared_ptr<chrono::fea::ChNodeFEAxyzP> mnode;
  istringstream stoken;
  map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
  parsed_nodes;
  double tokenvals [20];
  istringstream ss;
  ifstream fin;
  ChVector<double> local_918;
  undefined8 local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  undefined1 local_8a9;
  ChNodeFEAxyzP *local_8a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_8a0 [2];
  shared_ptr<chrono::fea::ChMesh> *local_890;
  _Base_ptr local_888;
  uint local_87c;
  undefined1 local_878 [24];
  double local_860;
  element_type *local_858;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_850;
  shared_ptr<chrono::fea::ChElementBase> local_848;
  element_type *local_838;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_830;
  string local_828;
  undefined8 uStack_808;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_800;
  undefined8 uStack_7f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7f0;
  ios_base local_7b0 [264];
  shared_ptr<chrono::fea::ChNodeFEAbase> local_6a8;
  shared_ptr<chrono::fea::ChElementBase> local_698;
  undefined8 local_688;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_680;
  undefined8 local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_670;
  double local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_660;
  pointer local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_650;
  pointer local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_640;
  undefined8 local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_630;
  double local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_620;
  undefined8 local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_610;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_608;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_5f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>_>_>
  *local_5e0;
  ChVector<double> *local_5d8;
  ChMatrix33<double> *local_5d0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
  local_5c8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8 [5];
  string local_438;
  string local_418;
  string local_3f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>_>
  local_3d8 [2];
  ios_base local_360 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5c8._M_impl.super__Rb_tree_header._M_header;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5e0 = node_sets;
  local_5d8 = pos_transform;
  local_5d0 = rot_transform;
  local_5c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::ifstream::ifstream((istream *)local_238,filename,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_828,filename,(allocator *)local_4d8);
    std::operator+(&local_3d8[0].first,"ERROR opening Abaqus .inp file: ",&local_828);
    plVar26 = (long *)std::__cxx11::string::append((char *)local_3d8);
    psVar30 = (size_type *)(plVar26 + 2);
    local_4f8._M_dataplus._M_p = (pointer)*plVar26;
    if ((size_type *)local_4f8._M_dataplus._M_p == psVar30) {
      local_4f8.field_2._M_allocated_capacity = *psVar30;
      local_4f8.field_2._8_8_ = plVar26[3];
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    }
    else {
      local_4f8.field_2._M_allocated_capacity = *psVar30;
    }
    local_4f8._M_string_length = plVar26[1];
    *plVar26 = (long)psVar30;
    plVar26[1] = 0;
    *(undefined1 *)(plVar26 + 2) = 0;
    ChException::ChException(pCVar25,&local_4f8);
    __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
  }
  local_890 = mesh;
  pCVar19 = GetLog();
  pCVar20 = ChStreamOutAscii::operator<<
                      (&pCVar19->super_ChStreamOutAscii,"Parsing Abaqus INP file: ");
  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,filename);
  ChStreamOutAscii::operator<<(pCVar20,"\n");
  local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
  local_8f8 = 0;
  local_888 = (_Base_ptr)0x0;
  local_8d0._M_string_length = 0;
  local_8d0.field_2._M_local_buf[0] = '\0';
  do {
    local_87c = (uint)local_8f8 & 0xfffffffe;
LAB_00609e4f:
    do {
      cVar17 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                               (char)(istream *)local_238);
      piVar21 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_8d0,cVar17);
      psVar16 = local_890;
      _Var14._M_p = local_8d0._M_dataplus._M_p;
      if (((byte)piVar21[*(long *)(*(long *)piVar21 + -0x18) + 0x20] & 5) != 0) {
        if ((discard_unused_nodes) &&
           ((_Rb_tree_header *)local_5c8._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_5c8._M_impl.super__Rb_tree_header)) {
          p_Var24 = local_5c8._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if (*(char *)&p_Var24[1]._M_right == '\x01') {
              local_6a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)p_Var24[1]._M_parent;
              local_6a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var24[1]._M_left
              ;
              pCVar11 = (psVar16->
                        super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              p_Var12 = p_Var24[1]._M_left;
              if (p_Var12 != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&p_Var12->_M_parent = *(int *)&p_Var12->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&p_Var12->_M_parent = *(int *)&p_Var12->_M_parent + 1;
                }
              }
              ChMesh::AddNode(pCVar11,&local_6a8);
              if ((_Base_ptr)
                  local_6a8.
                  super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_6a8.
                           super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
            }
            p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
          } while ((_Rb_tree_header *)p_Var24 != &local_5c8._M_impl.super__Rb_tree_header);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
          operator_delete(local_8d0._M_dataplus._M_p,
                          CONCAT71(local_8d0.field_2._M_allocated_capacity._1_7_,
                                   local_8d0.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(local_238);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
        ::~_Rb_tree(&local_5c8);
        return;
      }
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_8d0._M_dataplus._M_p + local_8d0._M_string_length);
      _Var34._M_p = local_8d0._M_dataplus._M_p;
      if (0 < (long)local_8d0._M_string_length >> 2) {
        lVar27 = ((long)local_8d0._M_string_length >> 2) + 1;
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_8d0._M_dataplus._M_p + 3);
        _Var34._M_p = local_8d0._M_dataplus._M_p + (local_8d0._M_string_length & 0xfffffffffffffffc)
        ;
        do {
          iVar18 = isspace((uint)(byte)paVar29->_M_local_buf[-3]);
          if (iVar18 == 0) {
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar29->_M_local_buf + -3);
            goto LAB_00609f5d;
          }
          iVar18 = isspace((uint)(byte)paVar29->_M_local_buf[-2]);
          if (iVar18 == 0) {
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar29->_M_local_buf + -2);
            goto LAB_00609f5d;
          }
          iVar18 = isspace((uint)(byte)paVar29->_M_local_buf[-1]);
          if (iVar18 == 0) {
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar29->_M_local_buf + -1);
            goto LAB_00609f5d;
          }
          iVar18 = isspace((uint)(byte)paVar29->_M_local_buf[0]);
          if (iVar18 == 0) goto LAB_00609f5d;
          lVar27 = lVar27 + -1;
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar29->_M_local_buf + 4);
        } while (1 < lVar27);
      }
      lVar27 = (long)paVar1 - (long)_Var34._M_p;
      if (lVar27 == 1) {
LAB_00609f39:
        iVar18 = isspace((uint)(byte)*_Var34._M_p);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var34._M_p;
        if (iVar18 != 0) {
          paVar29 = paVar1;
        }
LAB_00609f5d:
        if (paVar1 == paVar29) goto LAB_00609f79;
        std::__cxx11::string::_M_erase((ulong)&local_8d0,0);
      }
      else {
        if (lVar27 == 2) {
LAB_00609f28:
          iVar18 = isspace((uint)(byte)*_Var34._M_p);
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var34._M_p;
          if (iVar18 != 0) {
            _Var34._M_p = _Var34._M_p + 1;
            goto LAB_00609f39;
          }
          goto LAB_00609f5d;
        }
        if (lVar27 == 3) {
          iVar18 = isspace((uint)(byte)*_Var34._M_p);
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var34._M_p;
          if (iVar18 != 0) {
            _Var34._M_p = _Var34._M_p + 1;
            goto LAB_00609f28;
          }
          goto LAB_00609f5d;
        }
LAB_00609f79:
        local_8d0._M_string_length = 0;
        *_Var14._M_p = 0;
      }
      sVar15 = local_8d0._M_string_length;
      _Var14._M_p = local_8d0._M_dataplus._M_p;
      if (local_8d0._M_string_length != 0) {
        uVar33 = 0;
        do {
          iVar18 = toupper((uint)(byte)_Var14._M_p[uVar33]);
          _Var14._M_p[uVar33] = (byte)iVar18;
          uVar33 = uVar33 + 1;
        } while (sVar15 != uVar33);
      }
    } while (*local_8d0._M_dataplus._M_p == 0);
    if (*local_8d0._M_dataplus._M_p != 0x2a) {
      if ((int)local_8f8 == 1) {
        local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
        local_8f0._M_string_length = 0;
        local_8f0.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3d8,(string *)&local_8d0,_S_in);
        for (uVar33 = 0;
            (piVar21 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_3d8,(string *)&local_8f0,','),
            ((byte)piVar21[*(long *)(*(long *)piVar21 + -0x18) + 0x20] & 5) == 0 && (uVar33 < 0x14))
            ; uVar33 = uVar33 + 1) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_828,(string *)&local_8f0,_S_in);
          std::istream::_M_extract<double>((double *)&local_828);
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_828);
          std::ios_base::~ios_base(local_7b0);
        }
        if (uVar33 != 4) {
          pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_828,
                         "ERROR in .inp file, nodes require ID and three x y z coords, see line:\n",
                         &local_8d0);
          plVar26 = (long *)std::__cxx11::string::append((char *)&local_828);
          psVar30 = (size_type *)(plVar26 + 2);
          local_538._M_dataplus._M_p = (pointer)*plVar26;
          if ((size_type *)local_538._M_dataplus._M_p == psVar30) {
            local_538.field_2._M_allocated_capacity = *psVar30;
            local_538.field_2._8_8_ = plVar26[3];
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          }
          else {
            local_538.field_2._M_allocated_capacity = *psVar30;
          }
          local_538._M_string_length = plVar26[1];
          *plVar26 = (long)psVar30;
          plVar26[1] = 0;
          *(undefined1 *)(plVar26 + 2) = 0;
          ChException::ChException(pCVar25,&local_538);
          __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
        }
        auVar13._8_8_ = local_4d8[0].field_2._M_allocated_capacity;
        auVar13._0_8_ = local_4d8[0]._M_string_length;
        if ((((double)local_4d8[0]._M_string_length == -1e+31) &&
            (!NAN((double)local_4d8[0]._M_string_length))) ||
           (((double)local_4d8[0].field_2._0_8_ == -1e+31 &&
            (!NAN((double)local_4d8[0].field_2._0_8_))))) {
LAB_0060b4e7:
          pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_828,"ERROR in .inp file, in parsing x,y,z coordinates of node: \n",
                         &local_8d0);
          plVar26 = (long *)std::__cxx11::string::append((char *)&local_828);
          psVar30 = (size_type *)(plVar26 + 2);
          local_558._M_dataplus._M_p = (pointer)*plVar26;
          if ((size_type *)local_558._M_dataplus._M_p == psVar30) {
            local_558.field_2._M_allocated_capacity = *psVar30;
            local_558.field_2._8_8_ = plVar26[3];
            local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
          }
          else {
            local_558.field_2._M_allocated_capacity = *psVar30;
          }
          local_558._M_string_length = plVar26[1];
          *plVar26 = (long)psVar30;
          plVar26[1] = 0;
          *(undefined1 *)(plVar26 + 2) = 0;
          ChException::ChException(pCVar25,&local_558);
          __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
        }
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_4d8[0].field_2._8_8_;
        if (((double)local_4d8[0].field_2._8_8_ == -1e+31) &&
           (!NAN((double)local_4d8[0].field_2._8_8_))) goto LAB_0060b4e7;
        local_860 = (double)local_4d8[0].field_2._8_8_;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0];
        auVar37._8_8_ = 0;
        auVar37._0_8_ =
             (double)local_4d8[0].field_2._0_8_ *
             (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        auVar2 = vfmadd231sd_fma(auVar37,auVar13,auVar2);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[3];
        auVar38._8_8_ = 0;
        auVar38._0_8_ =
             (double)local_4d8[0].field_2._0_8_ *
             (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        auVar3 = vfmadd231sd_fma(auVar38,auVar13,auVar3);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
        auVar36._8_8_ = 0;
        auVar36._0_8_ =
             (double)local_4d8[0].field_2._0_8_ *
             (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar4 = vfmadd231sd_fma(auVar36,auVar13,auVar4);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[2];
        auVar2 = vfmadd231sd_fma(auVar2,auVar39,auVar5);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5];
        auVar3 = vfmadd231sd_fma(auVar3,auVar39,auVar6);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (local_5d0->super_Matrix<double,_3,_3,_1,_3,_3>).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8];
        auVar39 = vfmadd231sd_fma(auVar4,auVar39,auVar7);
        local_828._M_dataplus._M_p = (pointer)(auVar2._0_8_ + local_5d8->m_data[0]);
        local_828._M_string_length = (size_type)(auVar3._0_8_ + local_5d8->m_data[1]);
        local_828.field_2._M_allocated_capacity = (size_type)(auVar39._0_8_ + local_5d8->m_data[2]);
        peVar9 = (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_878._0_16_ = auVar13;
        if (peVar9 == (element_type *)0x0) {
LAB_0060b3b8:
          pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_418,
                     "ERROR in .inp generation. Material type not supported. \n","");
          ChException::ChException(pCVar25,&local_418);
          __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
        }
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_4d8[0]._M_dataplus._M_p;
        uVar35 = vcvttsd2usi_avx512f(auVar8);
        lVar27 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,&ChContinuumElastic::typeinfo,
                                0);
        if (lVar27 == 0) {
          lVar27 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                  &ChContinuumPoisson3D::typeinfo,0);
          if (lVar27 == 0) goto LAB_0060b3b8;
          p_Var10 = (my_material->
                    super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          local_918.m_data[2] = local_860;
          local_8a8 = (ChNodeFEAxyzP *)0x0;
          local_918.m_data[0] = (double)local_878._0_8_;
          local_918.m_data[1] = (double)local_878._8_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChNodeFEAxyzP,std::allocator<chrono::fea::ChNodeFEAxyzP>,chrono::ChVector<double>>
                    (a_Stack_8a0,&local_8a8,(allocator<chrono::fea::ChNodeFEAxyzP> *)&local_8a9,
                     &local_918);
          (*(local_8a8->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[4])(local_8a8,(ulong)uVar35);
          local_878._8_8_ = a_Stack_8a0[0]._M_pi;
          local_878._0_8_ = local_8a8;
          if (a_Stack_8a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (a_Stack_8a0[0]._M_pi)->_M_use_count = (a_Stack_8a0[0]._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (a_Stack_8a0[0]._M_pi)->_M_use_count = (a_Stack_8a0[0]._M_pi)->_M_use_count + 1;
            }
          }
          local_918.m_data[0] = (double)CONCAT44(local_918.m_data[0]._4_4_,uVar35);
          pmVar22 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::operator[]((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                                  *)&local_5c8,(key_type *)&local_918);
          p_Var10 = (pmVar22->first).
                    super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_878._0_8_;
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_878._8_8_;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          pmVar22->second = false;
          _Var32._M_pi = a_Stack_8a0[0]._M_pi;
          if (!discard_unused_nodes) {
            pCVar11 = (local_890->
                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_608.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = &local_8a8->super_ChNodeFEAbase;
            local_608.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_8a0[0]._M_pi;
            if (a_Stack_8a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_8a0[0]._M_pi)->_M_use_count = (a_Stack_8a0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_8a0[0]._M_pi)->_M_use_count = (a_Stack_8a0[0]._M_pi)->_M_use_count + 1;
              }
            }
            ChMesh::AddNode(pCVar11,&local_608);
            _Var32._M_pi = a_Stack_8a0[0]._M_pi;
            if (local_608.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_608.
                         super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var32._M_pi = a_Stack_8a0[0]._M_pi;
            }
          }
        }
        else {
          p_Var10 = (my_material->
                    super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          local_918.m_data[0] = 0.0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_918.m_data + 1),
                     (ChNodeFEAxyz **)&local_918,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_8a8,
                     (ChVector<double> *)&local_828);
          (*((ChElementTetrahedron *)local_918.m_data[0])->_vptr_ChElementTetrahedron[4])
                    (local_918.m_data[0],(ulong)uVar35);
          local_878._8_8_ = local_918.m_data[1];
          local_878._0_8_ = local_918.m_data[0];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
            }
          }
          local_8a8 = (ChNodeFEAxyzP *)CONCAT44(local_8a8._4_4_,uVar35);
          pmVar22 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::operator[]((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                                  *)&local_5c8,(key_type *)&local_8a8);
          p_Var10 = (pmVar22->first).
                    super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_878._0_8_;
          (pmVar22->first).
          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_878._8_8_;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          pmVar22->second = false;
          _Var32._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1];
          if (!discard_unused_nodes) {
            pCVar11 = (local_890->
                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_5f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_918.m_data[0];
            local_5f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1] !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
              }
            }
            ChMesh::AddNode(pCVar11,&local_5f8);
            _Var32._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1];
            if (local_5f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_5f8.
                         super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var32._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1];
            }
          }
        }
        if (_Var32._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var32._M_pi);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3d8);
        std::ios_base::~ios_base(local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
          operator_delete(local_8f0._M_dataplus._M_p,
                          CONCAT71(local_8f0.field_2._M_allocated_capacity._1_7_,
                                   local_8f0.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_87c == 2) {
        local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
        local_8f0._M_string_length = 0;
        local_8f0.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3d8,(string *)&local_8d0,_S_in);
        for (uVar33 = 0;
            (piVar21 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_3d8,(string *)&local_8f0,','),
            ((byte)piVar21[*(long *)(*(long *)piVar21 + -0x18) + 0x20] & 5) == 0 && (uVar33 < 0x14))
            ; uVar33 = uVar33 + 1) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_828,(string *)&local_8f0,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&local_828);
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_828);
          std::ios_base::~ios_base(local_7b0);
        }
        if ((int)local_8f8 == 2) {
          if (uVar33 != 5) {
            pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
            std::operator+(&local_828,
                           "ERROR in .inp file, tetrahedrons require ID and 4 node IDs, see line:\n"
                           ,&local_8d0);
            plVar26 = (long *)std::__cxx11::string::append((char *)&local_828);
            psVar30 = (size_type *)(plVar26 + 2);
            local_598._M_dataplus._M_p = (pointer)*plVar26;
            if ((size_type *)local_598._M_dataplus._M_p == psVar30) {
              local_598.field_2._M_allocated_capacity = *psVar30;
              local_598.field_2._8_8_ = plVar26[3];
              local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
            }
            else {
              local_598.field_2._M_allocated_capacity = *psVar30;
            }
            local_598._M_string_length = plVar26[1];
            *plVar26 = (long)psVar30;
            plVar26[1] = 0;
            *(undefined1 *)(plVar26 + 2) = 0;
            ChException::ChException(pCVar25,&local_598);
            __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
          }
        }
        else if (((int)local_8f8 == 3) && (uVar33 != 0xb)) {
          pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_828,
                         "ERROR in .inp file, tetrahedrons require ID and 10 node IDs, see line:\n",
                         &local_8d0);
          plVar26 = (long *)std::__cxx11::string::append((char *)&local_828);
          psVar30 = (size_type *)(plVar26 + 2);
          local_578._M_dataplus._M_p = (pointer)*plVar26;
          if ((size_type *)local_578._M_dataplus._M_p == psVar30) {
            local_578.field_2._M_allocated_capacity = *psVar30;
            local_578.field_2._8_8_ = plVar26[3];
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
          }
          else {
            local_578.field_2._M_allocated_capacity = *psVar30;
          }
          local_578._M_string_length = plVar26[1];
          *plVar26 = (long)psVar30;
          plVar26[1] = 0;
          *(undefined1 *)(plVar26 + 2) = 0;
          ChException::ChException(pCVar25,&local_578);
          __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
        }
        peVar9 = (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if ((peVar9 == (element_type *)0x0) ||
           ((lVar27 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                     &ChContinuumElastic::typeinfo,0), lVar27 == 0 &&
            (lVar27 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                     &ChContinuumPoisson3D::typeinfo,0), lVar27 == 0)))) {
          pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_438,"ERROR in .inp generation. Material type not supported.\n"
                     ,"");
          ChException::ChException(pCVar25,&local_438);
          __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
        }
        p_Var10 = (my_material->
                  super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
        }
        lVar27 = 1;
        psVar30 = &local_828._M_string_length;
        local_828._M_dataplus._M_p = (pointer)0x0;
        local_828._M_string_length = 0;
        local_828.field_2._M_allocated_capacity = 0;
        local_828.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uStack_808 = 0;
        p_Stack_800 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uStack_7f8 = 0;
        p_Stack_7f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          local_918.m_data[0] =
               (double)CONCAT44(local_918.m_data[0]._4_4_,
                                *(undefined4 *)((long)&local_4d8[0]._M_dataplus._M_p + lVar27 * 4));
          pmVar22 = std::
                    map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                    ::at((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                          *)&local_5c8,(key_type *)&local_918);
          (((string *)(psVar30 + -1))->_M_dataplus)._M_p =
               (pointer)(pmVar22->first).
                        super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)psVar30,
                     &(pmVar22->first).
                      super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          psVar30 = psVar30 + 2;
          lVar27 = lVar27 + 1;
          pmVar22->second = true;
        } while (lVar27 != 5);
        peVar9 = (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar9 != (element_type *)0x0) {
          ppuVar31 = &ChContinuumMaterial::typeinfo;
          lVar27 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                  &ChContinuumElastic::typeinfo,0);
          if (lVar27 == 0) {
            ppuVar31 = &ChContinuumMaterial::typeinfo;
            lVar27 = __dynamic_cast(peVar9,&ChContinuumMaterial::typeinfo,
                                    &ChContinuumPoisson3D::typeinfo,0);
            if (lVar27 == 0) goto LAB_0060abb0;
            p_Var10 = (my_material->
                      super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              }
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
            }
            pCVar23 = (ChElementTetraCorot_4 *)
                      ChElementTetraCorot_4_P::operator_new
                                ((ChElementTetraCorot_4_P *)0x1c0,(size_t)ppuVar31);
            ChElementTetraCorot_4_P::ChElementTetraCorot_4_P((ChElementTetraCorot_4_P *)pCVar23);
            local_918.m_data[0] = (double)pCVar23;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::fea::ChElementTetraCorot_4_P*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_918.m_data + 1),
                       (ChElementTetraCorot_4_P *)pCVar23);
            local_658 = local_828._M_dataplus._M_p;
            p_Stack_650 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828._M_string_length
            ;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_828._M_string_length + 8) =
                     *(_Atomic_word *)(local_828._M_string_length + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_828._M_string_length + 8) =
                     *(_Atomic_word *)(local_828._M_string_length + 8) + 1;
              }
            }
            local_668 = (double)local_828.field_2._M_allocated_capacity;
            p_Stack_660 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828.field_2._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828.field_2._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_828.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_828.field_2._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_828.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_828.field_2._8_8_ + 8) + 1;
              }
            }
            local_678 = uStack_808;
            p_Stack_670 = p_Stack_800;
            if (p_Stack_800 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_800->_M_use_count = p_Stack_800->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_800->_M_use_count = p_Stack_800->_M_use_count + 1;
              }
            }
            local_688 = uStack_7f8;
            p_Stack_680 = p_Stack_7f0;
            if (p_Stack_7f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_7f0->_M_use_count = p_Stack_7f0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_7f0->_M_use_count = p_Stack_7f0->_M_use_count + 1;
              }
            }
            (*((ChElementTetrahedron *)local_918.m_data[0])->_vptr_ChElementTetrahedron[0x16])
                      (local_918.m_data[0],&local_658,&local_668,&local_678,&local_688);
            if (p_Stack_680 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_680);
            }
            if (p_Stack_670 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_670);
            }
            if (p_Stack_660 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_660);
            }
            if (p_Stack_650 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_650);
            }
            local_858 = (my_material->
                        super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
            local_850._M_pi =
                 (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_850._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_850._M_pi)->_M_use_count = (local_850._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_850._M_pi)->_M_use_count = (local_850._M_pi)->_M_use_count + 1;
              }
            }
            (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               *)((long)local_918.m_data[0] + 0xa0))->
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_858;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_918.m_data[0] + 0xb8),&local_850);
            if (local_850._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_850._M_pi);
            }
            pCVar11 = (local_890->
                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_698.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_918.m_data[0];
            local_698.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1] !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
              }
            }
            ChMesh::AddElement(pCVar11,&local_698);
            _Var32._M_pi = local_698.
                           super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          else {
            p_Var10 = (my_material->
                      super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              }
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
            }
            pCVar23 = (ChElementTetraCorot_4 *)
                      ChElementTetraCorot_4::operator_new
                                ((ChElementTetraCorot_4 *)0x1c0,(size_t)ppuVar31);
            ChElementTetraCorot_4::ChElementTetraCorot_4(pCVar23);
            local_918.m_data[0] = (double)pCVar23;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::fea::ChElementTetraCorot_4*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_918.m_data + 1),pCVar23)
            ;
            local_618 = uStack_7f8;
            p_Stack_610 = p_Stack_7f0;
            if (p_Stack_7f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_7f0->_M_use_count = p_Stack_7f0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_7f0->_M_use_count = p_Stack_7f0->_M_use_count + 1;
              }
            }
            local_628 = (double)local_828.field_2._M_allocated_capacity;
            p_Stack_620 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828.field_2._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828.field_2._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_828.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_828.field_2._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_828.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_828.field_2._8_8_ + 8) + 1;
              }
            }
            local_638 = uStack_808;
            p_Stack_630 = p_Stack_800;
            if (p_Stack_800 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_800->_M_use_count = p_Stack_800->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_800->_M_use_count = p_Stack_800->_M_use_count + 1;
              }
            }
            local_648 = local_828._M_dataplus._M_p;
            p_Stack_640 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828._M_string_length
            ;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_828._M_string_length + 8) =
                     *(_Atomic_word *)(local_828._M_string_length + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_828._M_string_length + 8) =
                     *(_Atomic_word *)(local_828._M_string_length + 8) + 1;
              }
            }
            (*((ChElementTetrahedron *)local_918.m_data[0])->_vptr_ChElementTetrahedron[7])
                      (local_918.m_data[0],&local_618,&local_628,&local_638,&local_648);
            if (p_Stack_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_640);
            }
            if (p_Stack_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_630);
            }
            if (p_Stack_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_620);
            }
            if (p_Stack_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_610);
            }
            local_838 = (element_type *)
                        (my_material->
                        super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
            local_830._M_pi =
                 (my_material->
                 super___shared_ptr<chrono::fea::ChContinuumMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_830._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_830._M_pi)->_M_use_count = (local_830._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_830._M_pi)->_M_use_count = (local_830._M_pi)->_M_use_count + 1;
              }
            }
            (((shared_ptr<chrono::fea::ChContinuumElastic> *)((long)local_918.m_data[0] + 0xb8))->
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = local_838;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(((shared_ptr<chrono::fea::ChContinuumElastic> *)
                         ((long)local_918.m_data[0] + 0xb8))->
                        super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount,&local_830);
            if (local_830._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_830._M_pi);
            }
            pCVar11 = (local_890->
                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_848.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)((long)local_918.m_data[0] + 8);
            if ((ChElementTetraCorot_4 *)local_918.m_data[0] == (ChElementTetraCorot_4 *)0x0) {
              local_848.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
            }
            local_848.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1] !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)((long)local_918.m_data[1] + 8) =
                     *(_Atomic_word *)((long)local_918.m_data[1] + 8) + 1;
              }
            }
            ChMesh::AddElement(pCVar11,&local_848);
            _Var32._M_pi = local_848.
                           super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          if (_Var32._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var32._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.m_data[1]);
          }
        }
LAB_0060abb0:
        lVar27 = 0x40;
        do {
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&local_830._M_pi + lVar27);
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          lVar27 = lVar27 + -0x10;
        } while (lVar27 != 0);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3d8);
        std::ios_base::~ios_base(local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
          operator_delete(local_8f0._M_dataplus._M_p,
                          CONCAT71(local_8f0.field_2._M_allocated_capacity._1_7_,
                                   local_8f0.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((int)local_8f8 == 4) {
        local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
        local_8f0._M_string_length = 0;
        local_8f0.field_2._M_local_buf[0] = '\0';
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3d8,(string *)&local_8d0,_S_in);
        uVar33 = 0;
        while (((piVar21 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_3d8,(string *)&local_8f0,','),
                ((byte)piVar21[*(long *)(*(long *)piVar21 + -0x18) + 0x20] & 5) == 0 &&
                (uVar33 < 0x14)) &&
               ((local_8f0._M_string_length == 0 ||
                (local_8f0._M_dataplus._M_p[local_8f0._M_string_length - 1] != '\r'))))) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_828,(string *)&local_8f0,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&local_828);
          uVar33 = uVar33 + 1;
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_828);
          std::ios_base::~ios_base(local_7b0);
        }
        if (uVar33 != 0) {
          uVar28 = 0;
          do {
            iVar18 = *(int *)((long)&local_4d8[0]._M_dataplus._M_p + uVar28 * 4);
            if (iVar18 < 1) {
              pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
              std::__cxx11::to_string
                        (&local_828,*(uint *)((long)&local_4d8[0]._M_dataplus._M_p + uVar28 * 4));
              std::operator+(&local_258,"ERROR in .inp file, negative node ID: ",&local_828);
              ChException::ChException(pCVar25,&local_258);
              __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
            }
            local_828._M_dataplus._M_p._0_4_ = iVar18;
            pmVar22 = std::
                      map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                      ::at((map<unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_bool>_>_>_>
                            *)&local_5c8,(key_type *)&local_828);
            std::
            vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
            ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                         *)local_888,&pmVar22->first);
            uVar28 = uVar28 + 1;
            pmVar22->second = true;
          } while (uVar33 != uVar28);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3d8);
        std::ios_base::~ios_base(local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
          operator_delete(local_8f0._M_dataplus._M_p,
                          CONCAT71(local_8f0.field_2._M_allocated_capacity._1_7_,
                                   local_8f0.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_00609e4f;
    }
    local_8f8 = 0;
    lVar27 = std::__cxx11::string::find((char *)&local_8d0,0x96df4e,0);
    if (lVar27 == 0) {
      uVar33 = std::__cxx11::string::find((char *)&local_8d0,0x96df54,0);
      local_8f8 = 1;
      if (uVar33 != 0) {
        std::__cxx11::string::find((char *)&local_8d0,0x9f326e,uVar33);
        std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_8d0);
        pCVar19 = GetLog();
        pCVar20 = ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"| parsing nodes ");
        pCVar20 = ChStreamOutAscii::operator<<(pCVar20,&local_3d8[0].first);
        ChStreamOutAscii::operator<<(pCVar20,"\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
      }
    }
    lVar27 = std::__cxx11::string::find((char *)&local_8d0,0x96df6b,0);
    if (lVar27 == 0) {
      uVar33 = std::__cxx11::string::find((char *)&local_8d0,0x96df94,0);
      if (uVar33 != 0) {
        std::__cxx11::string::find((char *)&local_8d0,0x9f326e,uVar33);
        std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_8d0);
        iVar18 = std::__cxx11::string::compare((char *)local_3d8);
        local_8f8 = 3;
        if ((iVar18 != 0) &&
           (iVar18 = std::__cxx11::string::compare((char *)local_3d8), iVar18 != 0)) {
          iVar18 = std::__cxx11::string::compare((char *)local_3d8);
          local_8f8 = 2;
          if (iVar18 != 0) {
            pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
            std::operator+(&local_8f0,"ERROR in .inp file, TYPE=",&local_3d8[0].first);
            plVar26 = (long *)std::__cxx11::string::append((char *)&local_8f0);
            psVar30 = (size_type *)(plVar26 + 2);
            local_4d8[0]._M_dataplus._M_p = (pointer)*plVar26;
            if ((size_type *)local_4d8[0]._M_dataplus._M_p == psVar30) {
              local_4d8[0].field_2._0_8_ = *psVar30;
              local_4d8[0].field_2._8_8_ = plVar26[3];
              local_4d8[0]._M_dataplus._M_p = (pointer)&local_4d8[0].field_2;
            }
            else {
              local_4d8[0].field_2._0_8_ = *psVar30;
            }
            local_4d8[0]._M_string_length = plVar26[1];
            *plVar26 = (long)psVar30;
            plVar26[1] = 0;
            *(undefined1 *)(plVar26 + 2) = 0;
            std::operator+(&local_828,local_4d8,&local_8d0);
            plVar26 = (long *)std::__cxx11::string::append((char *)&local_828);
            psVar30 = (size_type *)(plVar26 + 2);
            local_518._M_dataplus._M_p = (pointer)*plVar26;
            if ((size_type *)local_518._M_dataplus._M_p == psVar30) {
              local_518.field_2._M_allocated_capacity = *psVar30;
              local_518.field_2._8_8_ = plVar26[3];
              local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
            }
            else {
              local_518.field_2._M_allocated_capacity = *psVar30;
            }
            local_518._M_string_length = plVar26[1];
            *plVar26 = (long)psVar30;
            plVar26[1] = 0;
            *(undefined1 *)(plVar26 + 2) = 0;
            ChException::ChException(pCVar25,&local_518);
            __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
      }
      uVar33 = std::__cxx11::string::find((char *)&local_8d0,0x96dfd8,0);
      if (uVar33 != 0) {
        std::__cxx11::string::find((char *)&local_8d0,0x9f326e,uVar33);
        std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_8d0);
        pCVar19 = GetLog();
        pCVar20 = ChStreamOutAscii::operator<<
                            (&pCVar19->super_ChStreamOutAscii,"| parsing element set: ");
        pCVar20 = ChStreamOutAscii::operator<<(pCVar20,&local_3d8[0].first);
        ChStreamOutAscii::operator<<(pCVar20,"\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
      }
    }
    lVar27 = std::__cxx11::string::find((char *)&local_8d0,0x96dff7,0);
    if (lVar27 == 0) {
      uVar33 = std::__cxx11::string::find((char *)&local_8d0,0x96df54,5);
      local_8f8 = 4;
      if (uVar33 != 0) {
        std::__cxx11::string::find((char *)&local_8d0,0x9f326e,uVar33);
        std::__cxx11::string::substr((ulong)&local_828,(ulong)&local_8d0);
        pCVar19 = GetLog();
        pCVar20 = ChStreamOutAscii::operator<<
                            (&pCVar19->super_ChStreamOutAscii,"| parsing nodeset: ");
        pCVar20 = ChStreamOutAscii::operator<<(pCVar20,&local_828);
        ChStreamOutAscii::operator<<(pCVar20,"\n");
        local_3d8[0].first._M_dataplus._M_p = (pointer)&local_3d8[0].first.field_2;
        local_4d8[0].field_2._M_allocated_capacity = (pointer)0x0;
        local_4d8[0]._M_dataplus._M_p = (pointer)0x0;
        local_4d8[0]._M_string_length = 0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,local_828._M_dataplus._M_p,
                   (long)(_func_int ***)local_828._M_string_length + local_828._M_dataplus._M_p);
        local_3d8[0].second.
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4d8[0].field_2._0_8_;
        local_4d8[0].field_2._M_allocated_capacity = 0.0;
        local_3d8[0].second.
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4d8[0]._M_dataplus._M_p;
        local_3d8[0].second.
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4d8[0]._M_string_length;
        local_4d8[0]._M_dataplus._M_p = (pointer)0x0;
        local_4d8[0]._M_string_length = 0;
        pVar40 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>
                 ::
                 _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>>>>>>
                             *)local_5e0,local_3d8);
        local_888 = (_Base_ptr)pVar40.first._M_node;
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ::~vector(&local_3d8[0].second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0].first._M_dataplus._M_p != &local_3d8[0].first.field_2) {
          operator_delete(local_3d8[0].first._M_dataplus._M_p,
                          local_3d8[0].first.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
        ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                   *)local_4d8);
        if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar25 = (ChException *)__cxa_allocate_exception(0x28);
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,
                     "ERROR in .inp file, multiple NSET with same name has been specified\n","");
          ChException::ChException(pCVar25,&local_3f8);
          __cxa_throw(pCVar25,&ChException::typeinfo,ChException::~ChException);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_dataplus._M_p != &local_828.field_2) {
          operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
        }
        local_888 = local_888 + 2;
        local_8f8 = 4;
      }
    }
  } while( true );
}

Assistant:

void ChMeshFileLoader::FromAbaqusFile(std::shared_ptr<ChMesh> mesh,
                                      const char* filename,
                                      std::shared_ptr<ChContinuumMaterial> my_material,
                                      std::map<std::string, std::vector<std::shared_ptr<ChNodeFEAbase>>>& node_sets,
                                      ChVector<> pos_transform,
                                      ChMatrix33<> rot_transform,
                                      bool discard_unused_nodes) {
    std::map<unsigned int, std::pair<std::shared_ptr<ChNodeFEAbase>, bool>> parsed_nodes;
    std::vector<std::shared_ptr<ChNodeFEAbase>>* current_nodeset_vector = nullptr;

    enum eChAbaqusParserSection {
        E_PARSE_UNKNOWN = 0,
        E_PARSE_NODES_XYZ,
        E_PARSE_TETS_4,
        E_PARSE_TETS_10,
        E_PARSE_NODESET
    } e_parse_section = E_PARSE_UNKNOWN;

    std::ifstream fin(filename);
    if (fin.good())
        GetLog() << "Parsing Abaqus INP file: " << filename << "\n";
    else
        throw ChException("ERROR opening Abaqus .inp file: " + std::string(filename) + "\n");

    std::string line;
    while (std::getline(fin, line)) {
        // trims white space from the beginning of the string
        line.erase(line.begin(),
                   std::find_if(line.begin(), line.end(), [](unsigned char c) { return !std::isspace(c); }));

        // convert parsed line to uppercase (since string::find is case sensitive and Abaqus INP is not)
        std::for_each(line.begin(), line.end(), [](char& c) { c = toupper(static_cast<unsigned char>(c)); });

        // skip empty lines
        if (line[0] == 0)
            continue;

        // check if the current line opens a new section
        if (line[0] == '*') {
            e_parse_section = E_PARSE_UNKNOWN;

            if (line.find("*NODE") == 0) {
                std::string::size_type nse = line.find("NSET=");
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_node_set = line.substr(nse + 5, ncom - (nse + 5));
                    GetLog() << "| parsing nodes " << s_node_set << "\n";
                }
                e_parse_section = E_PARSE_NODES_XYZ;
            }

            if (line.find("*ELEMENT") == 0) {
                std::string::size_type nty = line.find("TYPE=");
                if (nty > 0) {
                    std::string::size_type ncom = line.find(",", nty);
                    std::string s_ele_type = line.substr(nty + 5, ncom - (nty + 5));
                    e_parse_section = E_PARSE_UNKNOWN;
                    if (s_ele_type == "C3D10") {
                        e_parse_section = E_PARSE_TETS_10;
                    } else if (s_ele_type == "DC3D10") {
                        e_parse_section = E_PARSE_TETS_10;
                    } else if (s_ele_type == "C3D4") {
                        e_parse_section = E_PARSE_TETS_4;
                    }
                    if (e_parse_section == E_PARSE_UNKNOWN) {
                        throw ChException("ERROR in .inp file, TYPE=" + s_ele_type +
                                          " (only C3D10 or DC3D10 or C3D4 tetrahedrons supported) see: \n" + line +
                                          "\n");
                    }
                }
                std::string::size_type nse = line.find("ELSET=");
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_ele_set = line.substr(nse + 6, ncom - (nse + 6));
                    GetLog() << "| parsing element set: " << s_ele_set << "\n";
                }
            }

            if (line.find("*NSET") == 0) {
                std::string::size_type nse = line.find("NSET=", 5);
                if (nse > 0) {
                    std::string::size_type ncom = line.find(",", nse);
                    std::string s_node_set = line.substr(nse + 5, ncom - (nse + 5));
                    GetLog() << "| parsing nodeset: " << s_node_set << "\n";
                    auto new_node =
                        node_sets.insert(std::pair<std::string, std::vector<std::shared_ptr<ChNodeFEAbase>>>(
                            s_node_set, std::vector<std::shared_ptr<ChNodeFEAbase>>()));
                    if (new_node.second) {
                        current_nodeset_vector = &new_node.first->second;
                    } else
                        throw ChException("ERROR in .inp file, multiple NSET with same name has been specified\n");
                }
                e_parse_section = E_PARSE_NODESET;
            }

            continue;
        }

        // node parsing
        if (e_parse_section == E_PARSE_NODES_XYZ) {
            int idnode = 0;
            double x = -10e30;
            double y = -10e30;
            double z = -10e30;
            double tokenvals[20];
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            if (ntoken != 4)
                throw ChException("ERROR in .inp file, nodes require ID and three x y z coords, see line:\n" + line +
                                  "\n");

            x = tokenvals[1];
            y = tokenvals[2];
            z = tokenvals[3];
            if (x == -10e30 || y == -10e30 || z == -10e30)
                throw ChException("ERROR in .inp file, in parsing x,y,z coordinates of node: \n" + line + "\n");

            // TODO: is it worth to keep a so specific routine inside this function?
            // especially considering that is affecting only some types of elements...
            ChVector<> node_position(x, y, z);
            node_position = rot_transform * node_position;  // rotate/scale, if needed
            node_position = pos_transform + node_position;  // move, if needed

            idnode = static_cast<unsigned int>(tokenvals[0]);
            if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material)) {
                auto mnode = chrono_types::make_shared<ChNodeFEAxyz>(node_position);
                mnode->SetIndex(idnode);
                parsed_nodes[idnode] = std::make_pair(mnode, false);
                if (!discard_unused_nodes)
                    mesh->AddNode(mnode);
            } else if (std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                auto mnode = chrono_types::make_shared<ChNodeFEAxyzP>(ChVector<>(x, y, z));
                mnode->SetIndex(idnode);
                parsed_nodes[idnode] = std::make_pair(mnode, false);
                if (!discard_unused_nodes)
                    mesh->AddNode(mnode);
            } else
                throw ChException("ERROR in .inp generation. Material type not supported. \n");
        }

        // element parsing
        if (e_parse_section == E_PARSE_TETS_10 || e_parse_section == E_PARSE_TETS_4) {
            ////int idelem = 0;
            unsigned int tokenvals[20];
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            if (e_parse_section == E_PARSE_TETS_10) {
                if (ntoken != 11)
                    throw ChException("ERROR in .inp file, tetrahedrons require ID and 10 node IDs, see line:\n" +
                                      line + "\n");
                // TODO: 'idelem' might be stored in an index in ChElementBase in order to provide consistency with the
                // INP file
                ////idelem = (int)tokenvals[0];

                for (int in = 0; in < 10; ++in)
                    if (tokenvals[in + 1] == -10e30)
                        throw ChException("ERROR in in .inp file, in parsing IDs of tetrahedron: \n" + line + "\n");
            } else if (e_parse_section == E_PARSE_TETS_4) {
                if (ntoken != 5)
                    throw ChException("ERROR in .inp file, tetrahedrons require ID and 4 node IDs, see line:\n" + line +
                                      "\n");

                // TODO: 'idelem' might be stored in an index in ChElementBase in order to provide consistency with the
                // INP file
                ////idelem = (int)tokenvals[0];

                for (int in = 0; in < 4; ++in)
                    if (tokenvals[in + 1] == -10e30)
                        throw ChException("ERROR in in .inp file, in parsing IDs of tetrahedron: \n" + line + "\n");
            }

            if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material) ||
                std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                std::array<std::shared_ptr<ChNodeFEAbase>, 4> element_nodes;
                for (auto node_sel = 0; node_sel < 4; ++node_sel) {
                    // check if the nodes required by the current element exist
                    std::pair<std::shared_ptr<ChNodeFEAbase>, bool>& node_found =
                        parsed_nodes.at(static_cast<unsigned int>(tokenvals[node_sel + 1]));

                    element_nodes[node_sel] = node_found.first;
                    node_found.second = true;
                }

                if (std::dynamic_pointer_cast<ChContinuumElastic>(my_material)) {
                    auto mel = chrono_types::make_shared<ChElementTetraCorot_4>();
                    mel->SetNodes(std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[3]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[1]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[2]),
                                  std::static_pointer_cast<ChNodeFEAxyz>(element_nodes[0]));
                    mel->SetMaterial(std::static_pointer_cast<ChContinuumElastic>(my_material));
                    mesh->AddElement(mel);

                } else if (std::dynamic_pointer_cast<ChContinuumPoisson3D>(my_material)) {
                    auto mel = chrono_types::make_shared<ChElementTetraCorot_4_P>();
                    mel->SetNodes(std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[0]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[1]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[2]),
                                  std::static_pointer_cast<ChNodeFEAxyzP>(element_nodes[3]));
                    mel->SetMaterial(std::static_pointer_cast<ChContinuumPoisson3D>(my_material));
                    mesh->AddElement(mel);
                }

            } else
                throw ChException("ERROR in .inp generation. Material type not supported.\n");
        }

        // parsing nodesets
        if (e_parse_section == E_PARSE_NODESET) {
            unsigned int tokenvals[20];  // strictly speaking, the maximum is 16 nodes for each line
            int ntoken = 0;

            std::string token;
            std::istringstream ss(line);
            while (std::getline(ss, token, ',') && ntoken < 20) {
                if (!token.empty() && token.back() == '\r') {
                    // Fix for possible Windows line ending (\r\n)
                    break;
                }
                std::istringstream stoken(token);
                stoken >> tokenvals[ntoken];
                ++ntoken;
            }

            for (auto node_sel = 0; node_sel < ntoken; ++node_sel) {
                auto idnode = static_cast<int>(tokenvals[node_sel]);
                if (idnode > 0) {
                    // check if the nodeset is asking for an existing node
                    std::pair<std::shared_ptr<ChNodeFEAbase>, bool>& node_found =
                        parsed_nodes.at(static_cast<unsigned int>(tokenvals[node_sel]));

                    current_nodeset_vector->push_back(node_found.first);
                    // flag the node to be saved later into the mesh
                    node_found.second = true;

                } else
                    throw ChException("ERROR in .inp file, negative node ID: " + std::to_string(tokenvals[node_sel]));
            }
        }

    }  // end while

    // only used nodes have been saved in 'parsed_nodes_used' and are now inserted in the mesh node list
    if (discard_unused_nodes) {
        for (auto node_it = parsed_nodes.begin(); node_it != parsed_nodes.end(); ++node_it) {
            if (node_it->second.second)
                mesh->AddNode(node_it->second.first);
        }
    }
}